

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O1

Gia_Man_t * Bmc_CexBuildNetwork2(Gia_Man_t *p,Abc_Cex_t *pCex,int fStart)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  char *pcVar8;
  Gia_Obj_t *pGVar9;
  long lVar10;
  Gia_Man_t *pGVar11;
  int iVar12;
  uint uVar13;
  Vec_Int_t *pVVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  int iVar26;
  
  if (pCex->nRegs != 0) {
    __assert_fail("pCex->nRegs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x86,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->nPis != p->vCis->nSize) {
    __assert_fail("pCex->nPis == Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x87,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  if (pCex->iFrame < fStart) {
    __assert_fail("fStart <= pCex->iFrame",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0x88,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  p_00 = Gia_ManStart(1000);
  pcVar8 = (char *)malloc(6);
  builtin_strncpy(pcVar8,"unate",6);
  p_00->pName = pcVar8;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs & 0xffffffffbfffffff;
  *(ulong *)p->pObjs = *(ulong *)p->pObjs | 0x4000000000000000;
  p->pObjs->Value = 0xffffffff;
  iVar12 = p->nRegs;
  if (0 < iVar12) {
    iVar26 = 0;
    do {
      iVar6 = p->vCos->nSize;
      uVar15 = (iVar6 - iVar12) + iVar26;
      if (((int)uVar15 < 0) || (iVar6 <= (int)uVar15)) goto LAB_004fdc6d;
      iVar6 = p->vCos->pArray[uVar15];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_004fdc4e;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar12 = ((p->vCis->nSize * (fStart + 1) + pCex->nRegs) - iVar12) + iVar26;
      pGVar4 = p->pObjs + iVar6;
      *(ulong *)pGVar4 =
           *(ulong *)pGVar4 & 0xbfffffffbfffffff |
           (ulong)(((uint)(&pCex[1].iPo)[iVar12 >> 5] >> ((byte)iVar12 & 0x1f) & 1) << 0x1e);
      pGVar9 = Gia_ManAppendObj(p_00);
      uVar23 = *(ulong *)pGVar9;
      *(ulong *)pGVar9 = uVar23 | 0x9fffffff;
      *(ulong *)pGVar9 =
           uVar23 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p_00->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_004fdc8c:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p_00->pObjs;
      if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_004fdc8c;
      uVar15 = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      if ((int)uVar15 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                      ,0x10f,"int Abc_LitNotCond(int, int)");
      }
      pGVar4->Value = uVar15 | (*(uint *)pGVar4 >> 0x1e & 1) == 0;
      iVar26 = iVar26 + 1;
      iVar12 = p->nRegs;
    } while (iVar26 < iVar12);
  }
  Gia_ManHashAlloc(p_00);
  uVar15 = p->vCis->nSize * fStart + pCex->nRegs;
  if (fStart <= pCex->iFrame) {
    do {
      pVVar14 = p->vCis;
      iVar12 = pVVar14->nSize;
      iVar26 = p->nRegs;
      if (iVar26 < iVar12) {
        lVar10 = 0;
        do {
          if (iVar12 <= lVar10) goto LAB_004fdc6d;
          lVar20 = (long)pVVar14->pArray[lVar10];
          if ((lVar20 < 0) || (p->nObjs <= pVVar14->pArray[lVar10])) goto LAB_004fdc4e;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          *(ulong *)(pGVar4 + lVar20) =
               (ulong)(((uint)(&pCex[1].iPo)[(int)((ulong)uVar15 + lVar10) >> 5] >>
                        ((byte)((ulong)uVar15 + lVar10) & 0x1f) & 1) << 0x1e) | 0x4000000000000000 |
               *(ulong *)(pGVar4 + lVar20) & 0xbfffffffbfffffff;
          pGVar4[lVar20].Value = 0xffffffff;
          lVar10 = lVar10 + 1;
          pVVar14 = p->vCis;
          iVar12 = pVVar14->nSize;
          iVar26 = p->nRegs;
        } while (lVar10 < iVar12 - iVar26);
        uVar15 = uVar15 + (int)lVar10;
      }
      iVar12 = p->nRegs;
      if (0 < iVar12) {
        iVar6 = 0;
        do {
          iVar1 = p->vCos->nSize;
          uVar17 = (iVar1 - iVar12) + iVar6;
          if (((int)uVar17 < 0) || (iVar1 <= (int)uVar17)) goto LAB_004fdc6d;
          iVar1 = p->vCos->pArray[uVar17];
          if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_004fdc4e;
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar17 = (iVar2 - iVar12) + iVar6;
          if (((int)uVar17 < 0) || (iVar2 <= (int)uVar17)) goto LAB_004fdc6d;
          iVar12 = p->vCis->pArray[uVar17];
          lVar10 = (long)iVar12;
          if ((lVar10 < 0) || (p->nObjs <= iVar12)) goto LAB_004fdc4e;
          pGVar3 = pGVar4 + iVar1;
          uVar23 = *(ulong *)pGVar3;
          uVar19 = *(ulong *)(pGVar4 + lVar10);
          *(ulong *)(pGVar4 + lVar10) = uVar19 & 0xffffffffbfffffff | uVar23 & 0x40000000;
          *(ulong *)(pGVar4 + lVar10) =
               uVar19 & 0xbfffffffbfffffff | uVar23 & 0x40000000 |
               *(ulong *)pGVar3 & 0x4000000000000000;
          pGVar4[lVar10].Value = pGVar3->Value;
          iVar6 = iVar6 + 1;
          iVar12 = p->nRegs;
        } while (iVar6 < iVar12);
      }
      if (0 < p->nObjs) {
        lVar10 = 0;
        lVar20 = 0;
        do {
          pGVar4 = p->pObjs;
          if (pGVar4 == (Gia_Obj_t *)0x0) break;
          uVar23 = *(ulong *)(&pGVar4->field_0x0 + lVar10);
          uVar17 = (uint)uVar23;
          if ((uVar23 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar17) {
            uVar22 = *(uint *)((long)pGVar4 +
                              (ulong)(uint)((int)(uVar23 & 0x1fffffff) << 2) * -3 + lVar10) >> 0x1e;
            uVar7 = uVar22 & 1;
            uVar25 = (uint)(uVar23 >> 0x1d);
            uVar13 = uVar25 & 1;
            uVar24 = (uint)(uVar23 >> 0x1e);
            uVar16 = *(uint *)((long)pGVar4 + (ulong)(uVar24 & 0x7ffffffc) * -3 + lVar10) >> 0x1e &
                     1;
            uVar18 = (uint)(uVar23 >> 0x3d) & 1;
            uVar25 = (uVar16 ^ uVar18) & (uVar22 ^ uVar25 & 7);
            uVar19 = (ulong)(uVar25 << 0x1e);
            *(ulong *)(&pGVar4->field_0x0 + lVar10) = uVar23 & 0xffffffff3fffffff | uVar19;
            if (uVar25 == 0) {
              if ((uVar7 == uVar13) && (uVar16 == uVar18)) {
                uVar23 = uVar23 & 0xbfffffff3fffffff |
                         (*(ulong *)((long)pGVar4 + lVar10 + (ulong)(uVar24 & 0x7ffffffc) * -3) |
                         *(ulong *)((long)pGVar4 + lVar10 + (ulong)((uVar17 & 0x1fffffff) << 2) * -3
                                   )) & 0x4000000000000000;
              }
              else {
                if (uVar7 == uVar13) {
                  uVar24 = (uVar17 & 0x1fffffff) << 2;
                }
                else {
                  if (uVar16 != uVar18) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                                  ,0xb8,
                                  "Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
                  }
                  uVar24 = uVar24 & 0x7ffffffc;
                }
                uVar23 = uVar23 & 0xbfffffff3fffffff |
                         *(ulong *)((long)pGVar4 + lVar10 + (ulong)uVar24 * -3) & 0x4000000000000000
                ;
              }
            }
            else {
              uVar23 = uVar23 & 0xbfffffff3fffffff | uVar19 |
                       *(ulong *)((long)pGVar4 + lVar10 + (ulong)((uVar17 & 0x1fffffff) << 2) * -3)
                       & 0x4000000000000000 &
                       *(ulong *)((long)pGVar4 + lVar10 + (ulong)(uVar24 & 0x7ffffffc) * -3);
            }
            *(ulong *)(&pGVar4->field_0x0 + lVar10) = uVar23;
            *(undefined4 *)((long)&pGVar4->Value + lVar10) = 0xffffffff;
            if ((uVar23 & 0x4000000000000000) == 0) {
              uVar17 = (uint)uVar23;
              if (uVar17 >> 0x1e == 0) {
                if ((uVar7 == uVar13) && (uVar16 == uVar18)) {
                  iVar12 = Gia_ManHashOr(p_00,*(int *)((long)pGVar4 +
                                                      lVar10 + 8 +
                                                      (ulong)((uVar17 & 0x1fffffff) << 2) * -3),
                                         *(int *)((long)pGVar4 +
                                                 lVar10 + 8 +
                                                 (ulong)((uint)(uVar23 >> 0x1e) & 0x7ffffffc) * -3))
                  ;
                }
                else {
                  if (uVar7 == uVar13) {
                    uVar17 = (uVar17 & 0x1fffffff) << 2;
                  }
                  else {
                    if (uVar16 != uVar18) {
                      __assert_fail("0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                                    ,0xc4,
                                    "Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)"
                                   );
                    }
                    uVar17 = (uint)(uVar23 >> 0x1e) & 0x7ffffffc;
                  }
                  iVar12 = *(int *)((long)pGVar4 + lVar10 + (ulong)uVar17 * -3 + 8);
                }
              }
              else {
                iVar12 = Gia_ManHashAnd(p_00,*(int *)((long)pGVar4 +
                                                     lVar10 + 8 +
                                                     (ulong)((uVar17 & 0x1fffffff) << 2) * -3),
                                        *(int *)((long)pGVar4 +
                                                lVar10 + 8 +
                                                (ulong)((uint)(uVar23 >> 0x1e) & 0x7ffffffc) * -3));
              }
              *(int *)((long)&pGVar4->Value + lVar10) = iVar12;
              if (iVar12 == 0) {
                __assert_fail("pObj->Value > 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                              ,0xc5,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)"
                             );
              }
            }
          }
          lVar20 = lVar20 + 1;
          lVar10 = lVar10 + 0xc;
        } while (lVar20 < p->nObjs);
      }
      pVVar14 = p->vCos;
      if (0 < pVVar14->nSize) {
        lVar10 = 0;
        do {
          iVar12 = pVVar14->pArray[lVar10];
          if (((long)iVar12 < 0) || (p->nObjs <= iVar12)) goto LAB_004fdc4e;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar4 = p->pObjs + iVar12;
          uVar23 = *(ulong *)pGVar4;
          uVar19 = (ulong)((uint)uVar23 & 0x1fffffff);
          uVar21 = (ulong)(((uint)uVar23 * 2 ^ *(uint *)(pGVar4 + -uVar19)) & 0x40000000);
          *(ulong *)pGVar4 = uVar23 & 0xffffffffbfffffff | uVar21;
          *(ulong *)pGVar4 =
               uVar23 & 0xbfffffffbfffffff | uVar21 |
               *(ulong *)(pGVar4 + -uVar19) & 0x4000000000000000;
          pGVar4->Value = pGVar4[-uVar19].Value;
          lVar10 = lVar10 + 1;
          pVVar14 = p->vCos;
        } while (lVar10 < pVVar14->nSize);
      }
      uVar15 = uVar15 + iVar26;
      bVar5 = fStart < pCex->iFrame;
      fStart = fStart + 1;
    } while (bVar5);
  }
  Gia_ManHashStop(p_00);
  if (uVar15 != pCex->nBits) {
    __assert_fail("iBit == pCex->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                  ,0xd0,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
  }
  uVar15 = pCex->iPo;
  iVar12 = p->vCos->nSize;
  if (iVar12 - p->nRegs <= (int)uVar15) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if ((-1 < (int)uVar15) && ((int)uVar15 < iVar12)) {
    iVar12 = p->vCos->pArray[uVar15];
    lVar10 = (long)iVar12;
    if ((-1 < lVar10) && (iVar12 < p->nObjs)) {
      uVar23 = *(ulong *)(p->pObjs + lVar10);
      if (((uint)uVar23 >> 0x1e & 1) == 0) {
        __assert_fail("pObj->fMark0 == 1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                      ,0xd3,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
      }
      if ((uVar23 & 0x4000000000000000) != 0) {
        __assert_fail("pObj->fMark1 == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                      ,0xd4,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
      }
      uVar15 = p->pObjs[lVar10].Value;
      if (uVar15 == 0) {
        __assert_fail("pObj->Value > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcCexDepth.c"
                      ,0xd5,"Gia_Man_t *Bmc_CexBuildNetwork2(Gia_Man_t *, Abc_Cex_t *, int)");
      }
      Gia_ManAppendCo(p_00,uVar15);
      pGVar11 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar11;
    }
LAB_004fdc4e:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_004fdc6d:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Bmc_CexBuildNetwork2( Gia_Man_t * p, Abc_Cex_t * pCex, int fStart )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pObjRo, * pObjRi;
    int fCompl0, fCompl1;
    int i, k, iBit;
    assert( pCex->nRegs == 0 );
    assert( pCex->nPis == Gia_ManCiNum(p) );
    assert( fStart <= pCex->iFrame );
    // start the manager
    pNew = Gia_ManStart( 1000 );
    pNew->pName = Abc_UtilStrsav( "unate" );
    // set const0
    Gia_ManConst0(p)->fMark0 = 0; // value
    Gia_ManConst0(p)->fMark1 = 1; // care
    Gia_ManConst0(p)->Value  = ~0;
    // set init state
    Gia_ManForEachRi( p, pObj, k )
    {
        pObj->fMark0 = Abc_InfoHasBit( pCex->pData, pCex->nRegs + fStart * Gia_ManCiNum(p) + Gia_ManPiNum(p) + k );
        pObj->fMark1 = 0;
        pObj->Value  = Abc_LitNotCond( Gia_ManAppendCi(pNew), !pObj->fMark0 );
    }
    Gia_ManHashAlloc( pNew );
    iBit = pCex->nRegs + fStart * Gia_ManCiNum(p);
    for ( i = fStart; i <= pCex->iFrame; i++ )
    {
        //  primary inputs
        Gia_ManForEachPi( p, pObj, k )
        {
            pObj->fMark0 = Abc_InfoHasBit( pCex->pData, iBit++ );
            pObj->fMark1 = 1;
            pObj->Value  = ~0;
        }
        iBit += Gia_ManRegNum(p);
        // transfer 
        Gia_ManForEachRiRo( p, pObjRi, pObjRo, k )
        {
            pObjRo->fMark0 = pObjRi->fMark0;
            pObjRo->fMark1 = pObjRi->fMark1;
            pObjRo->Value  = pObjRi->Value;
        }
        // internal nodes
        Gia_ManForEachAnd( p, pObj, k )
        {
            fCompl0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            fCompl1 = Gia_ObjFanin1(pObj)->fMark0 ^ Gia_ObjFaninC1(pObj);
            pObj->fMark0 = fCompl0 & fCompl1;
            if ( pObj->fMark0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 & Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 && !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1 | Gia_ObjFanin1(pObj)->fMark1;
            else if ( !fCompl0 )
                pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            else if ( !fCompl1 )
                pObj->fMark1 = Gia_ObjFanin1(pObj)->fMark1;
            else assert( 0 );
            pObj->Value = ~0;
            if ( pObj->fMark1 )
                continue;
            if ( pObj->fMark0 )
                pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 && !fCompl1 )
                pObj->Value = Gia_ManHashOr( pNew, Gia_ObjFanin0(pObj)->Value, Gia_ObjFanin1(pObj)->Value );
            else if ( !fCompl0 )
                pObj->Value = Gia_ObjFanin0(pObj)->Value;
            else if ( !fCompl1 )
                pObj->Value = Gia_ObjFanin1(pObj)->Value;
            else assert( 0 );
            assert( pObj->Value > 0 );
        }
        // combinational outputs
        Gia_ManForEachCo( p, pObj, k )
        {
            pObj->fMark0 = Gia_ObjFanin0(pObj)->fMark0 ^ Gia_ObjFaninC0(pObj);
            pObj->fMark1 = Gia_ObjFanin0(pObj)->fMark1;
            pObj->Value  = Gia_ObjFanin0(pObj)->Value;
        }
    }
    Gia_ManHashStop( pNew );
    assert( iBit == pCex->nBits );
    // create primary output
    pObj = Gia_ManPo(p, pCex->iPo);
    assert( pObj->fMark0 == 1 );
    assert( pObj->fMark1 == 0 );
    assert( pObj->Value > 0 );
    Gia_ManAppendCo( pNew, pObj->Value );
    // cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}